

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase327::run(TestCase327 *this)

{
  StructBuilder builder_00;
  StructBuilder builder_01;
  StructReader reader;
  StructReader reader_00;
  Exception *segment;
  ArrayPtr<const_capnp::word> *pAVar1;
  AllocateResult AVar2;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar3;
  size_t local_268;
  Fault f;
  uint local_23c;
  StructBuilder builder;
  StructReader local_210;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  BuilderArena arena;
  MallocMessageBuilder message;
  
  MallocMessageBuilder::MallocMessageBuilder(&message,0,FIXED_SIZE);
  BuilderArena::BuilderArena(&arena,&message.super_MessageBuilder);
  AVar2 = BuilderArena::allocate(&arena,1);
  segment = (Exception *)AVar2.segment;
  f.exception = segment;
  PointerBuilder::initStruct(&builder,(PointerBuilder *)&f,(StructSize)0x40002);
  builder_00.capTable = builder.capTable;
  builder_00.segment = builder.segment;
  builder_00.data = builder.data;
  builder_00.pointers = builder.pointers;
  builder_00.dataSize = builder.dataSize;
  builder_00.pointerCount = builder.pointerCount;
  builder_00._38_2_ = builder._38_2_;
  setupStruct(builder_00);
  AVar3 = BuilderArena::getSegmentsForOutput(&arena);
  pAVar1 = AVar3.ptr;
  if (AVar3.size_ == 0xf) {
    if (kj::_::Debug::minSeverity < 3 && (Exception *)pAVar1->size_ != (Exception *)0x1) {
      local_268 = CONCAT44(local_268._4_4_,1);
      f.exception = (Exception *)pAVar1->size_;
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x158,ERROR,
                 "\"failed: expected \" \"(1u) == (segments[ 0].size())\", 1u, segments[ 0].size()",
                 (char (*) [47])"failed: expected (1u) == (segments[ 0].size())",(uint *)&local_268,
                 (unsigned_long *)&f);
    }
    if (kj::_::Debug::minSeverity < 3 && (Exception *)pAVar1[1].size_ != (Exception *)0x7) {
      local_268 = CONCAT44(local_268._4_4_,7);
      f.exception = (Exception *)pAVar1[1].size_;
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x159,ERROR,
                 "\"failed: expected \" \"(7u) == (segments[ 1].size())\", 7u, segments[ 1].size()",
                 (char (*) [47])"failed: expected (7u) == (segments[ 1].size())",(uint *)&local_268,
                 (unsigned_long *)&f);
    }
    if (kj::_::Debug::minSeverity < 3 && (Exception *)pAVar1[2].size_ != (Exception *)0x2) {
      local_268 = CONCAT44(local_268._4_4_,2);
      f.exception = (Exception *)pAVar1[2].size_;
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x15a,ERROR,
                 "\"failed: expected \" \"(2u) == (segments[ 2].size())\", 2u, segments[ 2].size()",
                 (char (*) [47])"failed: expected (2u) == (segments[ 2].size())",(uint *)&local_268,
                 (unsigned_long *)&f);
    }
    if (((Exception *)pAVar1[3].size_ != (Exception *)0x3) && (kj::_::Debug::minSeverity < 3)) {
      local_268 = CONCAT44(local_268._4_4_,3);
      f.exception = (Exception *)pAVar1[3].size_;
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x15b,ERROR,
                 "\"failed: expected \" \"(3u) == (segments[ 3].size())\", 3u, segments[ 3].size()",
                 (char (*) [47])"failed: expected (3u) == (segments[ 3].size())",(uint *)&local_268,
                 (unsigned_long *)&f);
    }
    if (((Exception *)pAVar1[4].size_ != (Exception *)0xa) && (kj::_::Debug::minSeverity < 3)) {
      local_268 = CONCAT44(local_268._4_4_,10);
      f.exception = (Exception *)pAVar1[4].size_;
      kj::_::Debug::log<char_const(&)[48],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x15c,ERROR,
                 "\"failed: expected \" \"(10u) == (segments[ 4].size())\", 10u, segments[ 4].size()"
                 ,(char (*) [48])"failed: expected (10u) == (segments[ 4].size())",
                 (uint *)&local_268,(unsigned_long *)&f);
    }
    if (((Exception *)pAVar1[5].size_ != (Exception *)0x2) && (kj::_::Debug::minSeverity < 3)) {
      local_268 = CONCAT44(local_268._4_4_,2);
      f.exception = (Exception *)pAVar1[5].size_;
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x15d,ERROR,
                 "\"failed: expected \" \"(2u) == (segments[ 5].size())\", 2u, segments[ 5].size()",
                 (char (*) [47])"failed: expected (2u) == (segments[ 5].size())",(uint *)&local_268,
                 (unsigned_long *)&f);
    }
    if (((Exception *)pAVar1[6].size_ != (Exception *)0x2) && (kj::_::Debug::minSeverity < 3)) {
      local_268 = CONCAT44(local_268._4_4_,2);
      f.exception = (Exception *)pAVar1[6].size_;
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x15e,ERROR,
                 "\"failed: expected \" \"(2u) == (segments[ 6].size())\", 2u, segments[ 6].size()",
                 (char (*) [47])"failed: expected (2u) == (segments[ 6].size())",(uint *)&local_268,
                 (unsigned_long *)&f);
    }
    if (((Exception *)pAVar1[7].size_ != (Exception *)0x2) && (kj::_::Debug::minSeverity < 3)) {
      local_268 = CONCAT44(local_268._4_4_,2);
      f.exception = (Exception *)pAVar1[7].size_;
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x15f,ERROR,
                 "\"failed: expected \" \"(2u) == (segments[ 7].size())\", 2u, segments[ 7].size()",
                 (char (*) [47])"failed: expected (2u) == (segments[ 7].size())",(uint *)&local_268,
                 (unsigned_long *)&f);
    }
    if (((Exception *)pAVar1[8].size_ != (Exception *)0x2) && (kj::_::Debug::minSeverity < 3)) {
      local_268 = CONCAT44(local_268._4_4_,2);
      f.exception = (Exception *)pAVar1[8].size_;
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x160,ERROR,
                 "\"failed: expected \" \"(2u) == (segments[ 8].size())\", 2u, segments[ 8].size()",
                 (char (*) [47])"failed: expected (2u) == (segments[ 8].size())",(uint *)&local_268,
                 (unsigned_long *)&f);
    }
    if (((Exception *)pAVar1[9].size_ != (Exception *)0x6) && (kj::_::Debug::minSeverity < 3)) {
      local_268 = CONCAT44(local_268._4_4_,6);
      f.exception = (Exception *)pAVar1[9].size_;
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x161,ERROR,
                 "\"failed: expected \" \"(6u) == (segments[ 9].size())\", 6u, segments[ 9].size()",
                 (char (*) [47])"failed: expected (6u) == (segments[ 9].size())",(uint *)&local_268,
                 (unsigned_long *)&f);
    }
    if (((Exception *)pAVar1[10].size_ != (Exception *)0x2) && (kj::_::Debug::minSeverity < 3)) {
      local_268 = CONCAT44(local_268._4_4_,2);
      f.exception = (Exception *)pAVar1[10].size_;
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x162,ERROR,
                 "\"failed: expected \" \"(2u) == (segments[10].size())\", 2u, segments[10].size()",
                 (char (*) [47])"failed: expected (2u) == (segments[10].size())",(uint *)&local_268,
                 (unsigned_long *)&f);
    }
    if (((Exception *)pAVar1[0xb].size_ != (Exception *)0x2) && (kj::_::Debug::minSeverity < 3)) {
      local_268 = CONCAT44(local_268._4_4_,2);
      f.exception = (Exception *)pAVar1[0xb].size_;
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x163,ERROR,
                 "\"failed: expected \" \"(2u) == (segments[11].size())\", 2u, segments[11].size()",
                 (char (*) [47])"failed: expected (2u) == (segments[11].size())",(uint *)&local_268,
                 (unsigned_long *)&f);
    }
    if (((Exception *)pAVar1[0xc].size_ != (Exception *)0x2) && (kj::_::Debug::minSeverity < 3)) {
      local_268 = CONCAT44(local_268._4_4_,2);
      f.exception = (Exception *)pAVar1[0xc].size_;
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x164,ERROR,
                 "\"failed: expected \" \"(2u) == (segments[12].size())\", 2u, segments[12].size()",
                 (char (*) [47])"failed: expected (2u) == (segments[12].size())",(uint *)&local_268,
                 (unsigned_long *)&f);
    }
    if (((Exception *)pAVar1[0xd].size_ != (Exception *)0x2) && (kj::_::Debug::minSeverity < 3)) {
      local_268 = CONCAT44(local_268._4_4_,2);
      f.exception = (Exception *)pAVar1[0xd].size_;
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x165,ERROR,
                 "\"failed: expected \" \"(2u) == (segments[13].size())\", 2u, segments[13].size()",
                 (char (*) [47])"failed: expected (2u) == (segments[13].size())",(uint *)&local_268,
                 (unsigned_long *)&f);
    }
    if (((Exception *)pAVar1[0xe].size_ != (Exception *)0x3) && (kj::_::Debug::minSeverity < 3)) {
      local_268 = CONCAT44(local_268._4_4_,3);
      f.exception = (Exception *)pAVar1[0xe].size_;
      kj::_::Debug::log<char_const(&)[47],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x166,ERROR,
                 "\"failed: expected \" \"(3u) == (segments[14].size())\", 3u, segments[14].size()",
                 (char (*) [47])"failed: expected (3u) == (segments[14].size())",(uint *)&local_268,
                 (unsigned_long *)&f);
    }
    builder_01.capTable = builder.capTable;
    builder_01.segment = builder.segment;
    builder_01.data = builder.data;
    builder_01.pointers = builder.pointers;
    builder_01.dataSize = builder.dataSize;
    builder_01.pointerCount = builder.pointerCount;
    builder_01._38_2_ = builder._38_2_;
    checkStruct(builder_01);
    StructBuilder::asReader(&builder);
    reader.capTable = (CapTableReader *)uStack_1d8;
    reader.segment = (SegmentReader *)local_1e0;
    reader.data = (void *)local_1d0;
    reader.pointers = (WirePointer *)uStack_1c8;
    reader.dataSize = (undefined4)local_1c0;
    reader.pointerCount = local_1c0._4_2_;
    reader._38_2_ = local_1c0._6_2_;
    reader._40_8_ = uStack_1b8;
    checkStruct(reader);
    PointerReader::getRoot
              ((PointerReader *)&f,(SegmentReader *)segment,(CapTableReader *)0x0,
               (((SegmentReader *)&segment->ownFile)->ptr).ptr,4);
    PointerReader::getStruct(&local_210,(PointerReader *)&f,(word *)0x0);
    reader_00.capTable = local_210.capTable;
    reader_00.segment = local_210.segment;
    reader_00.data = local_210.data;
    reader_00.pointers = local_210.pointers;
    reader_00.dataSize = local_210.dataSize;
    reader_00.pointerCount = local_210.pointerCount;
    reader_00._38_2_ = local_210._38_2_;
    reader_00.nestingLimit = local_210.nestingLimit;
    reader_00._44_4_ = local_210._44_4_;
    checkStruct(reader_00);
    BuilderArena::~BuilderArena(&arena);
    MallocMessageBuilder::~MallocMessageBuilder(&message);
    return;
  }
  local_23c = 0xf;
  local_268 = AVar3.size_;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_long>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
             ,0x154,FAILED,"(15u) == (segments.size())","15u, segments.size()",&local_23c,&local_268
            );
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

TEST(WireFormat, StructRoundTrip_OneSegmentPerAllocation) {
  MallocMessageBuilder message(0, AllocationStrategy::FIXED_SIZE);
  BuilderArena arena(&message);
  auto allocation = arena.allocate(1 * WORDS);
  SegmentBuilder* segment = allocation.segment;
  word* rootLocation = allocation.words;

  StructBuilder builder = PointerBuilder::getRoot(segment, nullptr, rootLocation)
      .initStruct(StructSize(2 * WORDS, 4 * POINTERS));
  setupStruct(builder);

  // Verify that we made 15 segments.
  kj::ArrayPtr<const kj::ArrayPtr<const word>> segments = arena.getSegmentsForOutput();
  ASSERT_EQ(15u, segments.size());

  // Check that each segment has the expected size.  Recall that the first word of each segment will
  // actually be a pointer to the first thing allocated within that segment.
  EXPECT_EQ( 1u, segments[ 0].size());  // root ref
  EXPECT_EQ( 7u, segments[ 1].size());  // root struct
  EXPECT_EQ( 2u, segments[ 2].size());  // sub-struct
  EXPECT_EQ( 3u, segments[ 3].size());  // 3-element int32 list
  EXPECT_EQ(10u, segments[ 4].size());  // struct list
  EXPECT_EQ( 2u, segments[ 5].size());  // struct list substruct 1
  EXPECT_EQ( 2u, segments[ 6].size());  // struct list substruct 2
  EXPECT_EQ( 2u, segments[ 7].size());  // struct list substruct 3
  EXPECT_EQ( 2u, segments[ 8].size());  // struct list substruct 4
  EXPECT_EQ( 6u, segments[ 9].size());  // list list
  EXPECT_EQ( 2u, segments[10].size());  // list list sublist 1
  EXPECT_EQ( 2u, segments[11].size());  // list list sublist 2
  EXPECT_EQ( 2u, segments[12].size());  // list list sublist 3
  EXPECT_EQ( 2u, segments[13].size());  // list list sublist 4
  EXPECT_EQ( 3u, segments[14].size());  // list list sublist 5

  checkStruct(builder);
  checkStruct(builder.asReader());
  checkStruct(PointerReader::getRoot(segment, nullptr, segment->getStartPtr(), 4)
      .getStruct(nullptr));
}